

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void lj_ffrecord_func(jit_State *J)

{
  uint32_t uVar1;
  undefined1 auStack_28 [4];
  uint32_t m;
  RecordFFData rd;
  jit_State *J_local;
  
  rd._16_8_ = J;
  uVar1 = recdef_lookup(J->fn);
  rd.nres._0_4_ = uVar1 & 0xff;
  rd.argv = (TValue *)0x1;
  _auStack_28 = *(TValue **)(*(long *)(rd._16_8_ + 0x80) + 0x20);
  *(undefined4 *)(*(long *)(rd._16_8_ + 0xa0) + (ulong)*(uint *)(rd._16_8_ + 0xac) * 4) = 0;
  (*recff_func[uVar1 >> 8])((jit_State *)rd._16_8_,(RecordFFData *)auStack_28);
  if (-1 < (long)rd.argv) {
    if (*(int *)(rd._16_8_ + 0x174) == 0) {
      *(undefined4 *)(rd._16_8_ + 0x174) = 6;
    }
    lj_record_ret((jit_State *)rd._16_8_,0,(ptrdiff_t)rd.argv);
  }
  return;
}

Assistant:

void lj_ffrecord_func(jit_State *J)
{
  RecordFFData rd;
  uint32_t m = recdef_lookup(J->fn);
  rd.data = m & 0xff;
  rd.nres = 1;  /* Default is one result. */
  rd.argv = J->L->base;
  J->base[J->maxslot] = 0;  /* Mark end of arguments. */
  (recff_func[m >> 8])(J, &rd);  /* Call recff_* handler. */
  if (rd.nres >= 0) {
    if (J->postproc == LJ_POST_NONE) J->postproc = LJ_POST_FFRETRY;
    lj_record_ret(J, 0, rd.nres);
  }
}